

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TruncCase::getInputValues(TruncCase *this,int numValues,void **values)

{
  undefined4 uVar1;
  pointer pSVar2;
  void *pvVar3;
  deUint32 dVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Float<unsigned_int,_8,_23,_127,_3U> FVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  Vec2 ranges [3];
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_76;
  float local_74;
  float local_70;
  Float<unsigned_int,_8,_23,_127,_3U> local_6c;
  ulong local_68;
  ulong local_60;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar4 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar4 ^ 0xac23f);
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (ulong)(pSVar2->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  iVar6 = 0;
  lVar9 = 0;
  do {
    if (0 < (int)uVar5) {
      uVar1 = (&DAT_01c57040)[lVar9];
      pvVar3 = *values;
      uVar10 = (ulong)uVar5;
      iVar11 = iVar6;
      do {
        *(undefined4 *)((long)pvVar3 + (long)iVar11 * 4) = uVar1;
        iVar11 = iVar11 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    lVar9 = lVar9 + 1;
    iVar6 = iVar6 + uVar5;
  } while (lVar9 != 6);
  uVar7 = (numValues + -6) * uVar5;
  local_60 = (ulong)(uint)numValues;
  if (0 < (int)uVar7) {
    local_70 = local_58[local_68 * 2];
    pvVar3 = *values;
    local_74 = local_58[local_68 * 2 + 1] - local_70;
    uVar10 = 0;
    do {
      fVar12 = deRandom_getFloat(&local_40);
      *(float *)((long)pvVar3 + uVar10 * 4 + (long)(int)(uVar5 * 6) * 4) =
           fVar12 * local_74 + local_70;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  if (((int)local_68 == 1) && (uVar5 = uVar5 * (int)local_60, 0 < (int)uVar5)) {
    uVar10 = 0;
    do {
      local_6c.m_value = *(StorageType *)((long)*values + uVar10 * 4);
      local_76.m_value = 0;
      local_76 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_6c)
      ;
      FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_76);
      *(StorageType *)((long)*values + uVar10 * 4) = FVar8.m_value;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const float				specialCases[]	= { 0.0f, -0.0f, -0.9f, 0.9f, 1.0f, -1.0f };
		const int				numSpecialCases	= DE_LENGTH_OF_ARRAY(specialCases);

		// Special cases
		for (int caseNdx = 0; caseNdx < numSpecialCases; caseNdx++)
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
				((float*)values[0])[caseNdx*scalarSize + scalarNdx] = specialCases[caseNdx];
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + scalarSize*numSpecialCases, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}